

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O1

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::LoadVariableOperator> *op)

{
  ostream *poVar1;
  element_type *peVar2;
  char *pcVar3;
  size_type sVar4;
  int local_24;
  
  AppendVariableDeclarationBegin(this);
  poVar1 = this->os;
  peVar2 = (op->super___shared_ptr<const_calc4::LoadVariableOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pcVar3 = (peVar2->variableName)._M_dataplus._M_p;
  sVar4 = (peVar2->variableName)._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"user_defined_var_",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,sVar4);
  AppendVariableDeclarationEnd(this);
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&(this->stack).c,&local_24);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const LoadVariableOperator>& op) override
    {
        AppendVariableDeclarationBegin();
        os << UserDefinedVariableName(op->GetVariableName());
        AppendVariableDeclarationEnd();
        Return();
    }